

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringhelper.cpp
# Opt level: O2

string * replaceGlobal(string *__return_storage_ptr__,string *targetString,string *oldValue,
                      string *newValue)

{
  long lVar1;
  string preOld;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&preOld);
  lVar1 = std::__cxx11::string::find((string *)targetString,(ulong)oldValue);
  while (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&preOld,(ulong)targetString);
    std::operator+(&local_50,&preOld,newValue);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    lVar1 = std::__cxx11::string::find((string *)targetString,(ulong)oldValue);
    std::__cxx11::string::~string((string *)&preOld);
  }
  std::__cxx11::string::substr((ulong)&preOld,(ulong)targetString);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&preOld);
  return __return_storage_ptr__;
}

Assistant:

string replaceGlobal( string targetString, string oldValue, string newValue ) {
    int pos = 0;
    string resultString = "";
    size_t targetPos = targetString.find( oldValue, pos );
    while( targetPos != string::npos ) {
        string preOld = targetString.substr( pos, targetPos - pos );
        resultString += preOld + newValue;
        pos = targetPos + oldValue.length();
        targetPos = targetString.find( oldValue, pos );
    }
    resultString += targetString.substr(pos);
    return resultString;
}